

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_TAG_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  switch(val) {
  case 1:
    pcVar2 = "DW_TAG_array_type";
    break;
  case 2:
    pcVar2 = "DW_TAG_class_type";
    break;
  case 3:
    pcVar2 = "DW_TAG_entry_point";
    break;
  case 4:
    pcVar2 = "DW_TAG_enumeration_type";
    break;
  case 5:
    pcVar2 = "DW_TAG_formal_parameter";
    break;
  case 6:
  case 7:
  case 9:
  case 0xc:
  case 0xe:
  case 0x14:
    goto switchD_001ca081_caseD_6;
  case 8:
    pcVar2 = "DW_TAG_imported_declaration";
    break;
  case 10:
    pcVar2 = "DW_TAG_label";
    break;
  case 0xb:
    pcVar2 = "DW_TAG_lexical_block";
    break;
  case 0xd:
    pcVar2 = "DW_TAG_member";
    break;
  case 0xf:
    pcVar2 = "DW_TAG_pointer_type";
    break;
  case 0x10:
    pcVar2 = "DW_TAG_reference_type";
    break;
  case 0x11:
    pcVar2 = "DW_TAG_compile_unit";
    break;
  case 0x12:
    pcVar2 = "DW_TAG_string_type";
    break;
  case 0x13:
    pcVar2 = "DW_TAG_structure_type";
    break;
  case 0x15:
    pcVar2 = "DW_TAG_subroutine_type";
    break;
  case 0x16:
    pcVar2 = "DW_TAG_typedef";
    break;
  case 0x17:
    pcVar2 = "DW_TAG_union_type";
    break;
  case 0x18:
    pcVar2 = "DW_TAG_unspecified_parameters";
    break;
  case 0x19:
    pcVar2 = "DW_TAG_variant";
    break;
  case 0x1a:
    pcVar2 = "DW_TAG_common_block";
    break;
  case 0x1b:
    pcVar2 = "DW_TAG_common_inclusion";
    break;
  case 0x1c:
    pcVar2 = "DW_TAG_inheritance";
    break;
  case 0x1d:
    pcVar2 = "DW_TAG_inlined_subroutine";
    break;
  case 0x1e:
    pcVar2 = "DW_TAG_module";
    break;
  case 0x1f:
    pcVar2 = "DW_TAG_ptr_to_member_type";
    break;
  case 0x20:
    pcVar2 = "DW_TAG_set_type";
    break;
  case 0x21:
    pcVar2 = "DW_TAG_subrange_type";
    break;
  case 0x22:
    pcVar2 = "DW_TAG_with_stmt";
    break;
  case 0x23:
    pcVar2 = "DW_TAG_access_declaration";
    break;
  case 0x24:
    pcVar2 = "DW_TAG_base_type";
    break;
  case 0x25:
    pcVar2 = "DW_TAG_catch_block";
    break;
  case 0x26:
    pcVar2 = "DW_TAG_const_type";
    break;
  case 0x27:
    pcVar2 = "DW_TAG_constant";
    break;
  case 0x28:
    pcVar2 = "DW_TAG_enumerator";
    break;
  case 0x29:
    pcVar2 = "DW_TAG_file_type";
    break;
  case 0x2a:
    pcVar2 = "DW_TAG_friend";
    break;
  case 0x2b:
    pcVar2 = "DW_TAG_namelist";
    break;
  case 0x2c:
    pcVar2 = "DW_TAG_namelist_item";
    break;
  case 0x2d:
    pcVar2 = "DW_TAG_packed_type";
    break;
  case 0x2e:
    pcVar2 = "DW_TAG_subprogram";
    break;
  case 0x2f:
    pcVar2 = "DW_TAG_template_type_parameter";
    break;
  case 0x30:
    pcVar2 = "DW_TAG_template_value_parameter";
    break;
  case 0x31:
    pcVar2 = "DW_TAG_thrown_type";
    break;
  case 0x32:
    pcVar2 = "DW_TAG_try_block";
    break;
  case 0x33:
    pcVar2 = "DW_TAG_variant_part";
    break;
  case 0x34:
    pcVar2 = "DW_TAG_variable";
    break;
  case 0x35:
    pcVar2 = "DW_TAG_volatile_type";
    break;
  case 0x36:
    pcVar2 = "DW_TAG_dwarf_procedure";
    break;
  case 0x37:
    pcVar2 = "DW_TAG_restrict_type";
    break;
  case 0x38:
    pcVar2 = "DW_TAG_interface_type";
    break;
  case 0x39:
    pcVar2 = "DW_TAG_namespace";
    break;
  case 0x3a:
    pcVar2 = "DW_TAG_imported_module";
    break;
  case 0x3b:
    pcVar2 = "DW_TAG_unspecified_type";
    break;
  case 0x3c:
    pcVar2 = "DW_TAG_partial_unit";
    break;
  case 0x3d:
    pcVar2 = "DW_TAG_imported_unit";
    break;
  case 0x3e:
    pcVar2 = "DW_TAG_mutable_type";
    break;
  case 0x3f:
    pcVar2 = "DW_TAG_condition";
    break;
  case 0x40:
    pcVar2 = "DW_TAG_shared_type";
    break;
  case 0x41:
    pcVar2 = "DW_TAG_type_unit";
    break;
  case 0x42:
    pcVar2 = "DW_TAG_rvalue_reference_type";
    break;
  case 0x43:
    pcVar2 = "DW_TAG_template_alias";
    break;
  case 0x44:
    pcVar2 = "DW_TAG_coarray_type";
    break;
  case 0x45:
    pcVar2 = "DW_TAG_generic_subrange";
    break;
  case 0x46:
    pcVar2 = "DW_TAG_dynamic_type";
    break;
  case 0x47:
    pcVar2 = "DW_TAG_atomic_type";
    break;
  case 0x48:
    pcVar2 = "DW_TAG_call_site";
    break;
  case 0x49:
    pcVar2 = "DW_TAG_call_site_parameter";
    break;
  case 0x4a:
    pcVar2 = "DW_TAG_skeleton_unit";
    break;
  case 0x4b:
    pcVar2 = "DW_TAG_immutable_type";
    break;
  default:
    switch(val) {
    case 0x4201:
      pcVar2 = "DW_TAG_SUN_function_template";
      break;
    case 0x4202:
      pcVar2 = "DW_TAG_SUN_class_template";
      break;
    case 0x4203:
      pcVar2 = "DW_TAG_SUN_struct_template";
      break;
    case 0x4204:
      pcVar2 = "DW_TAG_SUN_union_template";
      break;
    case 0x4205:
      pcVar2 = "DW_TAG_SUN_indirect_inheritance";
      break;
    case 0x4206:
      pcVar2 = "DW_TAG_SUN_codeflags";
      break;
    case 0x4207:
      pcVar2 = "DW_TAG_SUN_memop_info";
      break;
    case 0x4208:
      pcVar2 = "DW_TAG_SUN_omp_child_func";
      break;
    case 0x4209:
      pcVar2 = "DW_TAG_SUN_rtti_descriptor";
      break;
    case 0x420a:
      pcVar2 = "DW_TAG_SUN_dtor_info";
      break;
    case 0x420b:
      pcVar2 = "DW_TAG_SUN_dtor";
      break;
    case 0x420c:
      pcVar2 = "DW_TAG_SUN_f90_interface";
      break;
    case 0x420d:
      pcVar2 = "DW_TAG_SUN_fortran_vax_structure";
      break;
    default:
      switch(val) {
      case 0x4101:
        pcVar2 = "DW_TAG_format_label";
        break;
      case 0x4102:
        pcVar2 = "DW_TAG_function_template";
        break;
      case 0x4103:
        pcVar2 = "DW_TAG_class_template";
        break;
      case 0x4104:
        pcVar2 = "DW_TAG_GNU_BINCL";
        break;
      case 0x4105:
        pcVar2 = "DW_TAG_GNU_EINCL";
        break;
      case 0x4106:
        pcVar2 = "DW_TAG_GNU_template_template_parameter";
        break;
      case 0x4107:
        pcVar2 = "DW_TAG_GNU_template_parameter_pack";
        break;
      case 0x4108:
        pcVar2 = "DW_TAG_GNU_formal_parameter_pack";
        break;
      case 0x4109:
        pcVar2 = "DW_TAG_GNU_call_site";
        break;
      case 0x410a:
        pcVar2 = "DW_TAG_GNU_call_site_parameter";
        break;
      default:
        switch(val) {
        case 0x4080:
          pcVar2 = "DW_TAG_TI_far_type";
          break;
        case 0x4081:
          pcVar2 = "DW_TAG_MIPS_loop";
          break;
        case 0x4082:
          pcVar2 = "DW_TAG_TI_assign_register";
          break;
        case 0x4083:
          pcVar2 = "DW_TAG_TI_ioport_type";
          break;
        case 0x4084:
          pcVar2 = "DW_TAG_TI_restrict_type";
          break;
        case 0x4085:
          pcVar2 = "DW_TAG_TI_onchip_type";
          break;
        case 0x4086:
        case 0x4087:
        case 0x4088:
        case 0x4089:
        case 0x408a:
        case 0x408b:
        case 0x408c:
        case 0x408d:
        case 0x408e:
        case 0x408f:
          goto switchD_001ca081_caseD_6;
        case 0x4090:
          pcVar2 = "DW_TAG_HP_array_descriptor";
          break;
        default:
          switch(val) {
          case 0xb000:
            pcVar2 = "DW_TAG_BORLAND_property";
            break;
          case 0xb001:
            pcVar2 = "DW_TAG_BORLAND_Delphi_string";
            break;
          case 0xb002:
            pcVar2 = "DW_TAG_BORLAND_Delphi_dynamic_array";
            break;
          case 0xb003:
            pcVar2 = "DW_TAG_BORLAND_Delphi_set";
            break;
          case 0xb004:
            pcVar2 = "DW_TAG_BORLAND_Delphi_variant";
            break;
          default:
            switch(val) {
            case 0x8004:
              pcVar2 = "DW_TAG_ghs_namespace";
              break;
            case 0x8005:
              pcVar2 = "DW_TAG_ghs_using_namespace";
              break;
            case 0x8006:
              pcVar2 = "DW_TAG_ghs_using_declaration";
              break;
            case 0x8007:
              pcVar2 = "DW_TAG_ghs_template_templ_param";
              break;
            default:
              if (val == 0x42ff) {
                pcVar2 = "DW_TAG_SUN_hi";
              }
              else if (val == 0x5101) {
                pcVar2 = "DW_TAG_ALTIUM_circ_type";
              }
              else if (val == 0x5102) {
                pcVar2 = "DW_TAG_ALTIUM_mwa_circ_type";
              }
              else if (val == 0x5103) {
                pcVar2 = "DW_TAG_ALTIUM_rev_carry_type";
              }
              else if (val == 0x5111) {
                pcVar2 = "DW_TAG_ALTIUM_rom";
              }
              else if (val == 0x6000) {
                pcVar2 = "DW_TAG_LLVM_annotation";
              }
              else if (val == 0x8765) {
                pcVar2 = "DW_TAG_upc_shared_type";
              }
              else if (val == 0x8766) {
                pcVar2 = "DW_TAG_upc_strict_type";
              }
              else if (val == 0x8767) {
                pcVar2 = "DW_TAG_upc_relaxed_type";
              }
              else if (val == 0xa000) {
                pcVar2 = "DW_TAG_PGI_kanji_type";
              }
              else if (val == 0xa020) {
                pcVar2 = "DW_TAG_PGI_interface_block";
              }
              else {
                if (val != 0xffff) {
                  return -1;
                }
                pcVar2 = "DW_TAG_hi_user";
              }
            }
          }
        }
      }
    }
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_001ca081_caseD_6:
  return iVar1;
}

Assistant:

int
dwarf_get_TAG_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_TAG_array_type:
        *s_out = "DW_TAG_array_type";
        return DW_DLV_OK;
    case DW_TAG_class_type:
        *s_out = "DW_TAG_class_type";
        return DW_DLV_OK;
    case DW_TAG_entry_point:
        *s_out = "DW_TAG_entry_point";
        return DW_DLV_OK;
    case DW_TAG_enumeration_type:
        *s_out = "DW_TAG_enumeration_type";
        return DW_DLV_OK;
    case DW_TAG_formal_parameter:
        *s_out = "DW_TAG_formal_parameter";
        return DW_DLV_OK;
    case DW_TAG_imported_declaration:
        *s_out = "DW_TAG_imported_declaration";
        return DW_DLV_OK;
    case DW_TAG_label:
        *s_out = "DW_TAG_label";
        return DW_DLV_OK;
    case DW_TAG_lexical_block:
        *s_out = "DW_TAG_lexical_block";
        return DW_DLV_OK;
    case DW_TAG_member:
        *s_out = "DW_TAG_member";
        return DW_DLV_OK;
    case DW_TAG_pointer_type:
        *s_out = "DW_TAG_pointer_type";
        return DW_DLV_OK;
    case DW_TAG_reference_type:
        *s_out = "DW_TAG_reference_type";
        return DW_DLV_OK;
    case DW_TAG_compile_unit:
        *s_out = "DW_TAG_compile_unit";
        return DW_DLV_OK;
    case DW_TAG_string_type:
        *s_out = "DW_TAG_string_type";
        return DW_DLV_OK;
    case DW_TAG_structure_type:
        *s_out = "DW_TAG_structure_type";
        return DW_DLV_OK;
    case DW_TAG_subroutine_type:
        *s_out = "DW_TAG_subroutine_type";
        return DW_DLV_OK;
    case DW_TAG_typedef:
        *s_out = "DW_TAG_typedef";
        return DW_DLV_OK;
    case DW_TAG_union_type:
        *s_out = "DW_TAG_union_type";
        return DW_DLV_OK;
    case DW_TAG_unspecified_parameters:
        *s_out = "DW_TAG_unspecified_parameters";
        return DW_DLV_OK;
    case DW_TAG_variant:
        *s_out = "DW_TAG_variant";
        return DW_DLV_OK;
    case DW_TAG_common_block:
        *s_out = "DW_TAG_common_block";
        return DW_DLV_OK;
    case DW_TAG_common_inclusion:
        *s_out = "DW_TAG_common_inclusion";
        return DW_DLV_OK;
    case DW_TAG_inheritance:
        *s_out = "DW_TAG_inheritance";
        return DW_DLV_OK;
    case DW_TAG_inlined_subroutine:
        *s_out = "DW_TAG_inlined_subroutine";
        return DW_DLV_OK;
    case DW_TAG_module:
        *s_out = "DW_TAG_module";
        return DW_DLV_OK;
    case DW_TAG_ptr_to_member_type:
        *s_out = "DW_TAG_ptr_to_member_type";
        return DW_DLV_OK;
    case DW_TAG_set_type:
        *s_out = "DW_TAG_set_type";
        return DW_DLV_OK;
    case DW_TAG_subrange_type:
        *s_out = "DW_TAG_subrange_type";
        return DW_DLV_OK;
    case DW_TAG_with_stmt:
        *s_out = "DW_TAG_with_stmt";
        return DW_DLV_OK;
    case DW_TAG_access_declaration:
        *s_out = "DW_TAG_access_declaration";
        return DW_DLV_OK;
    case DW_TAG_base_type:
        *s_out = "DW_TAG_base_type";
        return DW_DLV_OK;
    case DW_TAG_catch_block:
        *s_out = "DW_TAG_catch_block";
        return DW_DLV_OK;
    case DW_TAG_const_type:
        *s_out = "DW_TAG_const_type";
        return DW_DLV_OK;
    case DW_TAG_constant:
        *s_out = "DW_TAG_constant";
        return DW_DLV_OK;
    case DW_TAG_enumerator:
        *s_out = "DW_TAG_enumerator";
        return DW_DLV_OK;
    case DW_TAG_file_type:
        *s_out = "DW_TAG_file_type";
        return DW_DLV_OK;
    case DW_TAG_friend:
        *s_out = "DW_TAG_friend";
        return DW_DLV_OK;
    case DW_TAG_namelist:
        *s_out = "DW_TAG_namelist";
        return DW_DLV_OK;
    case DW_TAG_namelist_item:
        *s_out = "DW_TAG_namelist_item";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x2c. DW_TAG_namelist_items */
    case DW_TAG_packed_type:
        *s_out = "DW_TAG_packed_type";
        return DW_DLV_OK;
    case DW_TAG_subprogram:
        *s_out = "DW_TAG_subprogram";
        return DW_DLV_OK;
    case DW_TAG_template_type_parameter:
        *s_out = "DW_TAG_template_type_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x2f. DW_TAG_template_type_param */
    case DW_TAG_template_value_parameter:
        *s_out = "DW_TAG_template_value_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x30. DW_TAG_template_value_param */
    case DW_TAG_thrown_type:
        *s_out = "DW_TAG_thrown_type";
        return DW_DLV_OK;
    case DW_TAG_try_block:
        *s_out = "DW_TAG_try_block";
        return DW_DLV_OK;
    case DW_TAG_variant_part:
        *s_out = "DW_TAG_variant_part";
        return DW_DLV_OK;
    case DW_TAG_variable:
        *s_out = "DW_TAG_variable";
        return DW_DLV_OK;
    case DW_TAG_volatile_type:
        *s_out = "DW_TAG_volatile_type";
        return DW_DLV_OK;
    case DW_TAG_dwarf_procedure:
        *s_out = "DW_TAG_dwarf_procedure";
        return DW_DLV_OK;
    case DW_TAG_restrict_type:
        *s_out = "DW_TAG_restrict_type";
        return DW_DLV_OK;
    case DW_TAG_interface_type:
        *s_out = "DW_TAG_interface_type";
        return DW_DLV_OK;
    case DW_TAG_namespace:
        *s_out = "DW_TAG_namespace";
        return DW_DLV_OK;
    case DW_TAG_imported_module:
        *s_out = "DW_TAG_imported_module";
        return DW_DLV_OK;
    case DW_TAG_unspecified_type:
        *s_out = "DW_TAG_unspecified_type";
        return DW_DLV_OK;
    case DW_TAG_partial_unit:
        *s_out = "DW_TAG_partial_unit";
        return DW_DLV_OK;
    case DW_TAG_imported_unit:
        *s_out = "DW_TAG_imported_unit";
        return DW_DLV_OK;
    case DW_TAG_mutable_type:
        *s_out = "DW_TAG_mutable_type";
        return DW_DLV_OK;
    case DW_TAG_condition:
        *s_out = "DW_TAG_condition";
        return DW_DLV_OK;
    case DW_TAG_shared_type:
        *s_out = "DW_TAG_shared_type";
        return DW_DLV_OK;
    case DW_TAG_type_unit:
        *s_out = "DW_TAG_type_unit";
        return DW_DLV_OK;
    case DW_TAG_rvalue_reference_type:
        *s_out = "DW_TAG_rvalue_reference_type";
        return DW_DLV_OK;
    case DW_TAG_template_alias:
        *s_out = "DW_TAG_template_alias";
        return DW_DLV_OK;
    case DW_TAG_coarray_type:
        *s_out = "DW_TAG_coarray_type";
        return DW_DLV_OK;
    case DW_TAG_generic_subrange:
        *s_out = "DW_TAG_generic_subrange";
        return DW_DLV_OK;
    case DW_TAG_dynamic_type:
        *s_out = "DW_TAG_dynamic_type";
        return DW_DLV_OK;
    case DW_TAG_atomic_type:
        *s_out = "DW_TAG_atomic_type";
        return DW_DLV_OK;
    case DW_TAG_call_site:
        *s_out = "DW_TAG_call_site";
        return DW_DLV_OK;
    case DW_TAG_call_site_parameter:
        *s_out = "DW_TAG_call_site_parameter";
        return DW_DLV_OK;
    case DW_TAG_skeleton_unit:
        *s_out = "DW_TAG_skeleton_unit";
        return DW_DLV_OK;
    case DW_TAG_immutable_type:
        *s_out = "DW_TAG_immutable_type";
        return DW_DLV_OK;
    case DW_TAG_TI_far_type:
        *s_out = "DW_TAG_TI_far_type";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4080. DW_TAG_lo_user */
    case DW_TAG_MIPS_loop:
        *s_out = "DW_TAG_MIPS_loop";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4081. DW_TAG_TI_near_type */
    case DW_TAG_TI_assign_register:
        *s_out = "DW_TAG_TI_assign_register";
        return DW_DLV_OK;
    case DW_TAG_TI_ioport_type:
        *s_out = "DW_TAG_TI_ioport_type";
        return DW_DLV_OK;
    case DW_TAG_TI_restrict_type:
        *s_out = "DW_TAG_TI_restrict_type";
        return DW_DLV_OK;
    case DW_TAG_TI_onchip_type:
        *s_out = "DW_TAG_TI_onchip_type";
        return DW_DLV_OK;
    case DW_TAG_HP_array_descriptor:
        *s_out = "DW_TAG_HP_array_descriptor";
        return DW_DLV_OK;
    case DW_TAG_format_label:
        *s_out = "DW_TAG_format_label";
        return DW_DLV_OK;
    case DW_TAG_function_template:
        *s_out = "DW_TAG_function_template";
        return DW_DLV_OK;
    case DW_TAG_class_template:
        *s_out = "DW_TAG_class_template";
        return DW_DLV_OK;
    case DW_TAG_GNU_BINCL:
        *s_out = "DW_TAG_GNU_BINCL";
        return DW_DLV_OK;
    case DW_TAG_GNU_EINCL:
        *s_out = "DW_TAG_GNU_EINCL";
        return DW_DLV_OK;
    case DW_TAG_GNU_template_template_parameter:
        *s_out = "DW_TAG_GNU_template_template_parameter";
        return DW_DLV_OK;
    /*  Skipping alternate spelling of value
        0x4106. DW_TAG_GNU_template_template_param */
    case DW_TAG_GNU_template_parameter_pack:
        *s_out = "DW_TAG_GNU_template_parameter_pack";
        return DW_DLV_OK;
    case DW_TAG_GNU_formal_parameter_pack:
        *s_out = "DW_TAG_GNU_formal_parameter_pack";
        return DW_DLV_OK;
    case DW_TAG_GNU_call_site:
        *s_out = "DW_TAG_GNU_call_site";
        return DW_DLV_OK;
    case DW_TAG_GNU_call_site_parameter:
        *s_out = "DW_TAG_GNU_call_site_parameter";
        return DW_DLV_OK;
    case DW_TAG_SUN_function_template:
        *s_out = "DW_TAG_SUN_function_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_class_template:
        *s_out = "DW_TAG_SUN_class_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_struct_template:
        *s_out = "DW_TAG_SUN_struct_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_union_template:
        *s_out = "DW_TAG_SUN_union_template";
        return DW_DLV_OK;
    case DW_TAG_SUN_indirect_inheritance:
        *s_out = "DW_TAG_SUN_indirect_inheritance";
        return DW_DLV_OK;
    case DW_TAG_SUN_codeflags:
        *s_out = "DW_TAG_SUN_codeflags";
        return DW_DLV_OK;
    case DW_TAG_SUN_memop_info:
        *s_out = "DW_TAG_SUN_memop_info";
        return DW_DLV_OK;
    case DW_TAG_SUN_omp_child_func:
        *s_out = "DW_TAG_SUN_omp_child_func";
        return DW_DLV_OK;
    case DW_TAG_SUN_rtti_descriptor:
        *s_out = "DW_TAG_SUN_rtti_descriptor";
        return DW_DLV_OK;
    case DW_TAG_SUN_dtor_info:
        *s_out = "DW_TAG_SUN_dtor_info";
        return DW_DLV_OK;
    case DW_TAG_SUN_dtor:
        *s_out = "DW_TAG_SUN_dtor";
        return DW_DLV_OK;
    case DW_TAG_SUN_f90_interface:
        *s_out = "DW_TAG_SUN_f90_interface";
        return DW_DLV_OK;
    case DW_TAG_SUN_fortran_vax_structure:
        *s_out = "DW_TAG_SUN_fortran_vax_structure";
        return DW_DLV_OK;
    case DW_TAG_SUN_hi:
        *s_out = "DW_TAG_SUN_hi";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_circ_type:
        *s_out = "DW_TAG_ALTIUM_circ_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_mwa_circ_type:
        *s_out = "DW_TAG_ALTIUM_mwa_circ_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_rev_carry_type:
        *s_out = "DW_TAG_ALTIUM_rev_carry_type";
        return DW_DLV_OK;
    case DW_TAG_ALTIUM_rom:
        *s_out = "DW_TAG_ALTIUM_rom";
        return DW_DLV_OK;
    case DW_TAG_LLVM_annotation:
        *s_out = "DW_TAG_LLVM_annotation";
        return DW_DLV_OK;
    case DW_TAG_ghs_namespace:
        *s_out = "DW_TAG_ghs_namespace";
        return DW_DLV_OK;
    case DW_TAG_ghs_using_namespace:
        *s_out = "DW_TAG_ghs_using_namespace";
        return DW_DLV_OK;
    case DW_TAG_ghs_using_declaration:
        *s_out = "DW_TAG_ghs_using_declaration";
        return DW_DLV_OK;
    case DW_TAG_ghs_template_templ_param:
        *s_out = "DW_TAG_ghs_template_templ_param";
        return DW_DLV_OK;
    case DW_TAG_upc_shared_type:
        *s_out = "DW_TAG_upc_shared_type";
        return DW_DLV_OK;
    case DW_TAG_upc_strict_type:
        *s_out = "DW_TAG_upc_strict_type";
        return DW_DLV_OK;
    case DW_TAG_upc_relaxed_type:
        *s_out = "DW_TAG_upc_relaxed_type";
        return DW_DLV_OK;
    case DW_TAG_PGI_kanji_type:
        *s_out = "DW_TAG_PGI_kanji_type";
        return DW_DLV_OK;
    case DW_TAG_PGI_interface_block:
        *s_out = "DW_TAG_PGI_interface_block";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_property:
        *s_out = "DW_TAG_BORLAND_property";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_string:
        *s_out = "DW_TAG_BORLAND_Delphi_string";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_dynamic_array:
        *s_out = "DW_TAG_BORLAND_Delphi_dynamic_array";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_set:
        *s_out = "DW_TAG_BORLAND_Delphi_set";
        return DW_DLV_OK;
    case DW_TAG_BORLAND_Delphi_variant:
        *s_out = "DW_TAG_BORLAND_Delphi_variant";
        return DW_DLV_OK;
    case DW_TAG_hi_user:
        *s_out = "DW_TAG_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}